

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

natwm_error monitor_setup(natwm_state *state,monitor_list **result)

{
  server_extension_type sVar1;
  uint uVar2;
  randr_monitor *monitor;
  void *pvVar3;
  natwm_error nVar4;
  server_extension *extension;
  list *plVar5;
  monitor *pmVar6;
  monitor_list *list;
  char *pcVar7;
  box_sizes bVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar9;
  box_sizes bVar10;
  long lVar11;
  undefined8 uVar12;
  box_sizes local_40;
  config_array *local_38;
  randr_monitor **monitors;
  
  uVar12 = 0x107f4a;
  extension = server_extension_detect(state->xcb);
  nVar4 = MEMORY_ALLOCATION_ERROR;
  if (extension == (server_extension *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  sVar1 = extension->type;
  uVar9 = (ulong)sVar1;
  plVar5 = list_create();
  if (uVar9 == 1) {
    if (plVar5 == (list *)0x0) {
      pcVar7 = "Xinerama";
      goto LAB_00108234;
    }
    local_38 = (config_array *)0x0;
    local_40.top = 0;
    local_40.right = 0;
    local_40.bottom = 0;
    local_40.left = 0;
    nVar4 = xinerama_get_screens(state,(xcb_rectangle_t **)&local_38,(size_t *)&local_40);
    if (nVar4 == NO_ERROR) {
      bVar8.top = 0;
      bVar8.right = 0;
      bVar8.bottom = 0;
      bVar8.left = 0;
      for (; (ulong)bVar8 < (ulong)local_40; bVar8 = (box_sizes)((long)bVar8 + 1)) {
        pmVar6 = monitor_create(bVar8._0_4_,*(xcb_rectangle_t *)(&local_38->length + (long)bVar8),
                                (workspace *)0x0);
        if (pmVar6 == (monitor *)0x0) {
          monitors_destroy(plVar5);
          list_destroy(plVar5);
          free(local_38);
          nVar4 = MEMORY_ALLOCATION_ERROR;
          plVar5 = (list *)0x0;
          goto LAB_00108144;
        }
        list_insert(plVar5,pmVar6);
      }
      free(local_38);
      goto LAB_0010810a;
    }
LAB_001080a2:
    list_destroy(plVar5);
    plVar5 = (list *)0x0;
LAB_00108144:
    if (nVar4 == NO_ERROR) {
LAB_00108155:
      if (plVar5->size == 0) {
        if (sVar1 < (NO_EXTENSION|XINERAMA)) {
          pcVar7 = (&PTR_anon_var_dwarf_ddaf_00111ce0)[uVar9];
        }
        else {
          pcVar7 = "";
        }
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find a %s screen",pcVar7);
        free(extension);
        return INVALID_INPUT_ERROR;
      }
      list = monitor_list_create(extension,plVar5);
      if (list == (monitor_list *)0x0) {
        free(extension);
        list_destroy(plVar5);
        return MEMORY_ALLOCATION_ERROR;
      }
      local_38 = (config_array *)0x0;
      config_find_array(state->config,"monitor.offsets",&local_38);
      if ((local_38 != (config_array *)0x0) && (local_38->length != 0)) {
        plVar5 = list->monitors;
        if (local_38->length < plVar5->size) {
          pcVar7 = 
          "Encountered more monitors than items in \'monitor.offsets\' array. Ignoring offsets";
LAB_00108309:
          internal_logger(natwm_logger,LEVEL_WARNING,pcVar7);
        }
        else {
          lVar11 = 0;
          while (plVar5 = (list *)plVar5->head, plVar5 != (list *)0x0) {
            pvVar3 = (void *)plVar5->size;
            local_40.top = 0;
            local_40.right = 0;
            local_40.bottom = 0;
            local_40.left = 0;
            if (local_38->values[lVar11]->type == ARRAY) {
              nVar4 = config_array_to_box_sizes((local_38->values[lVar11]->data).array,&local_40);
              if (nVar4 != NO_ERROR) {
                pcVar7 = "Skipping invalid monitor offset value";
                goto LAB_00108309;
              }
              *(box_sizes *)((long)pvVar3 + 0xc) = local_40;
              lVar11 = lVar11 + 1;
            }
            else {
              internal_logger(natwm_logger,LEVEL_WARNING,"Skipping invalid monitor offset value");
            }
          }
        }
      }
      ewmh_update_desktop_viewport(state,list);
      *result = list;
      return NO_ERROR;
    }
  }
  else {
    if (sVar1 == RANDR) {
      if (plVar5 == (list *)0x0) {
        pcVar7 = "RANDR";
        goto LAB_00108234;
      }
      local_38 = (config_array *)0x0;
      local_40.top = 0;
      local_40.right = 0;
      local_40.bottom = 0;
      local_40.left = 0;
      nVar4 = randr_get_screens(state,(randr_monitor ***)&local_38,(size_t *)&local_40);
      if (nVar4 != NO_ERROR) goto LAB_001080a2;
      bVar10.top = 0;
      bVar10.right = 0;
      bVar10.bottom = 0;
      bVar10.left = 0;
      for (; (ulong)bVar10 < (ulong)local_40; bVar10 = (box_sizes)((long)bVar10 + 1)) {
        monitor = (randr_monitor *)(&local_38->length)[(long)bVar10];
        if (monitor != (randr_monitor *)0x0) {
          pmVar6 = monitor_create(monitor->id,monitor->rect,(workspace *)0x0);
          if (pmVar6 == (monitor *)0x0) {
            monitors_destroy(plVar5);
            list_destroy(plVar5);
            nVar4 = MEMORY_ALLOCATION_ERROR;
            plVar5 = (list *)0x0;
            goto LAB_00108144;
          }
          list_insert(plVar5,pmVar6);
          randr_monitor_destroy(monitor);
        }
      }
      free(local_38);
LAB_0010810a:
      nVar4 = NO_ERROR;
      goto LAB_00108144;
    }
    nVar4 = MEMORY_ALLOCATION_ERROR;
    if (plVar5 != (list *)0x0) {
      uVar2._0_2_ = state->screen->width_in_pixels;
      uVar2._2_2_ = state->screen->height_in_pixels;
      pmVar6 = monitor_create(0,(xcb_rectangle_t)((ulong)uVar2 << 0x20),(workspace *)0x0);
      if (pmVar6 != (monitor *)0x0) {
        list_insert(plVar5,pmVar6);
        goto LAB_00108155;
      }
      list_destroy(plVar5);
      nVar4 = MEMORY_ALLOCATION_ERROR;
    }
  }
  if (uVar9 == 0) {
    pcVar7 = "RANDR";
  }
  else if (sVar1 == NO_EXTENSION) {
    pcVar7 = "X";
  }
  else if (sVar1 == XINERAMA) {
    pcVar7 = "Xinerama";
  }
  else {
    pcVar7 = "";
  }
LAB_00108234:
  internal_logger(natwm_logger,LEVEL_ERROR,"Failed to setup %s screen(s)",pcVar7,in_R8,in_R9,uVar12)
  ;
  free(extension);
  return nVar4;
}

Assistant:

enum natwm_error monitor_setup(const struct natwm_state *state, struct monitor_list **result)
{
        struct server_extension *extension = server_extension_detect(state->xcb);

        if (extension == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        // Resolve monitors from any extension into a linked list of generic
        // monitors.
        enum natwm_error err = GENERIC_ERROR;
        struct list *monitors = NULL;

        if (extension->type == RANDR) {
                err = monitors_from_randr(state, &monitors);
        } else if (extension->type == XINERAMA) {
                err = monitors_from_xinerama(state, &monitors);
        } else {
                err = monitor_from_x(state, &monitors);
        }

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to setup %s screen(s)",
                          server_extension_to_string(extension->type));

                free(extension);

                return err;
        }

        if (monitors->size == 0) {
                LOG_ERROR(natwm_logger,
                          "Failed to find a %s screen",
                          server_extension_to_string(extension->type));

                free(extension);

                return INVALID_INPUT_ERROR;
        }

        struct monitor_list *monitor_list = monitor_list_create(extension, monitors);

        if (monitor_list == NULL) {
                free(extension);
                list_destroy(monitors);

                return MEMORY_ALLOCATION_ERROR;
        }

        monitor_list_set_offsets(state, monitor_list);

        // Initialize the desktop viewport
        ewmh_update_desktop_viewport(state, monitor_list);

        *result = monitor_list;

        return NO_ERROR;
}